

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

Matrix4x4 * CGL::outer(Vector4D *u,Vector4D *v)

{
  double dVar1;
  Matrix4x4 *pMVar2;
  long lVar3;
  Matrix4x4 *B;
  Matrix4x4 *in_RDI;
  long lVar4;
  
  pMVar2 = in_RDI;
  in_RDI->entries[3].field_0.field_0.x = 0.0;
  in_RDI->entries[3].field_0.field_0.y = 0.0;
  in_RDI->entries[3].field_0.field_0.z = 0.0;
  in_RDI->entries[3].field_0.field_0.w = 0.0;
  in_RDI->entries[2].field_0.field_0.x = 0.0;
  in_RDI->entries[2].field_0.field_0.y = 0.0;
  in_RDI->entries[2].field_0.field_0.z = 0.0;
  in_RDI->entries[2].field_0.field_0.w = 0.0;
  in_RDI->entries[1].field_0.field_0.x = 0.0;
  in_RDI->entries[1].field_0.field_0.y = 0.0;
  in_RDI->entries[1].field_0.field_0.z = 0.0;
  in_RDI->entries[1].field_0.field_0.w = 0.0;
  in_RDI->entries[0].field_0.field_0.x = 0.0;
  in_RDI->entries[0].field_0.field_0.y = 0.0;
  in_RDI->entries[0].field_0.field_0.z = 0.0;
  in_RDI->entries[0].field_0.field_0.w = 0.0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    dVar1 = *(double *)((long)&u->field_0 + lVar3 * 8);
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
      *(double *)((long)&in_RDI->entries[0].field_0 + lVar4 * 4) =
           dVar1 * *(double *)((long)&v->field_0 + lVar4);
    }
    in_RDI = (Matrix4x4 *)((long)&in_RDI->entries[0].field_0 + 8);
  }
  return pMVar2;
}

Assistant:

Matrix4x4 outer(const Vector4D &u, const Vector4D &v) {
  Matrix4x4 B;

  // Opposite of an inner product.
  for (int i = 0; i < 4; i++)
    for (int j = 0; j < 4; j++) {
      B(i, j) = u[i] * v[j];
    }

  return B;
}